

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockBuilderVisitor.cpp
# Opt level: O2

void __thiscall IRT::BlockBuilderVisitor::BlockBuilderVisitor(BlockBuilderVisitor *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_Visitor)._vptr_Visitor = (_func_int **)&PTR__BlockBuilderVisitor_00162528;
  Label::Label(&this->current_label_);
  (this->blocks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->blocks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->blocks_)._M_t._M_impl.super__Rb_tree_header;
  this->current_root_ = (Statement *)0x0;
  this->root_block_ = (Block *)0x0;
  (this->blocks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->blocks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->blocks_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

BlockBuilderVisitor::BlockBuilderVisitor()
    : current_root_(nullptr), root_block_(nullptr) {}